

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall
soul::heart::Parser::scanFunction(Parser *this,ScannedTopLevelItem *item,bool isEventFunction)

{
  bool bVar1;
  string *psVar2;
  Module *pMVar3;
  undefined7 in_register_00000011;
  Identifier *args;
  Identifier *args_00;
  string_view sVar4;
  Identifier name;
  Identifier local_a0;
  ScannedTopLevelItem *local_98;
  Function *local_90;
  undefined1 local_88 [56];
  string local_50;
  
  local_a0 = parseGeneralIdentifier(this);
  if ((int)CONCAT71(in_register_00000011,isEventFunction) != 0) {
    psVar2 = Identifier::operator_cast_to_string_(&local_a0);
    bVar1 = isReservedFunctionName(psVar2);
    if (bVar1) {
      Errors::invalidEndpointName<soul::Identifier&>
                ((CompileMessage *)local_88,(Errors *)&local_a0,args);
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,(CompileMessage *)local_88);
      CompileMessage::~CompileMessage((CompileMessage *)local_88);
    }
  }
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  sVar4 = Identifier::operator_cast_to_basic_string_view(&local_a0);
  sVar4._M_str = (char *)sVar4._M_len;
  sVar4._M_len = (size_t)&pMVar3->functions;
  Module::Functions::find((Functions *)local_88,sVar4);
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    Errors::nameInUse<soul::Identifier&>((CompileMessage *)local_88,(Errors *)&local_a0,args_00);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,(CompileMessage *)local_88);
    CompileMessage::~CompileMessage((CompileMessage *)local_88);
  }
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  psVar2 = Identifier::operator_cast_to_string_(&local_a0);
  std::__cxx11::string::string((string *)(local_88 + 0x38),(string *)psVar2);
  local_90 = Module::Functions::add(&pMVar3->functions,(string *)(local_88 + 0x38),isEventFunction);
  std::__cxx11::string::~string((string *)(local_88 + 0x38));
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2c8be9);
  local_88._0_8_ =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  local_98 = item;
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::emplace_back<soul::UTF8Reader>
            (&item->functionParamCode,(UTF8Reader *)local_88);
  skipPastNextOccurrenceOf(this,(TokenType)0x2c67cb);
  while( true ) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2a351b);
    if (bVar1) {
      local_88._0_8_ =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::
      emplace_back<soul::UTF8Reader>(&local_98->functionBodyCode,(UTF8Reader *)local_88);
      skipPastNextOccurrenceOf(this,(TokenType)0x2a1eb4);
      return;
    }
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2a19e8);
    if (bVar1) break;
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x2a351d);
    if (bVar1) {
      skipPastNextOccurrenceOf(this,(TokenType)0x2a3276);
    }
    else {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,(TokenType)0x2c8da6);
      if (bVar1) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)0x2a351b);
      }
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      skip(&this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          );
    }
  }
  local_90->hasNoBody = true;
  local_88._0_8_ = (pointer)0x0;
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::emplace_back<soul::UTF8Reader>
            (&local_98->functionBodyCode,(UTF8Reader *)local_88);
  return;
}

Assistant:

void scanFunction (ScannedTopLevelItem& item, bool isEventFunction)
    {
        auto name = parseGeneralIdentifier();

        if (isEventFunction && heart::isReservedFunctionName (name))
            throwError (Errors::invalidEndpointName (name));

        if (module->functions.find (name) != nullptr)
            throwError (Errors::nameInUse (name));

        auto& fn = module->functions.add (name, isEventFunction);

        expect (HEARTOperator::openParen);
        item.functionParamCode.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::closeParen);

        for (;;)
        {
            if (matchIf (HEARTOperator::openBrace))
            {
                item.functionBodyCode.push_back (getCurrentTokeniserPosition());
                skipPastNextOccurrenceOf (HEARTOperator::closeBrace);
                break;
            }

            if (matchIf (HEARTOperator::semicolon))
            {
                fn.hasNoBody = true;
                item.functionBodyCode.push_back ({});
                break;
            }

            if (matchIf (HEARTOperator::openDoubleBracket))
            {
                skipPastNextOccurrenceOf (HEARTOperator::closeDoubleBracket);
                continue;
            }

            if (matches (Token::eof))
                expect (HEARTOperator::openBrace);

            skip();
        }
    }